

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  short sVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  ImGuiID IVar7;
  int iVar8;
  ulong uVar9;
  ImGuiWindowSettings *pIVar10;
  
  uVar5 = (ctx->Windows).Size;
  if (uVar5 != 0) {
    uVar9 = 0;
    do {
      if ((long)(int)uVar5 <= (long)uVar9) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                      ,0x62f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar2 = (ctx->Windows).Data[uVar9];
      if ((pIVar2->Flags & 0x100) == 0) {
        uVar5 = pIVar2->SettingsOffset;
        if ((ulong)uVar5 == 0xffffffff) {
          pIVar10 = ImGui::FindWindowSettings(pIVar2->ID);
        }
        else {
          if (((int)uVar5 < 4) || ((ctx->SettingsWindows).Buf.Size <= (int)uVar5)) {
            __assert_fail("off >= 4 && off < Buf.Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_internal.h"
                          ,599,
                          "T *ImChunkStream<ImGuiWindowSettings>::ptr_from_offset(int) [T = ImGuiWindowSettings]"
                         );
          }
          pIVar10 = (ImGuiWindowSettings *)((ctx->SettingsWindows).Buf.Data + uVar5);
        }
        if (pIVar10 == (ImGuiWindowSettings *)0x0) {
          pIVar10 = ImGui::CreateNewWindowSettings(pIVar2->Name);
          iVar6 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(&ctx->SettingsWindows,pIVar10)
          ;
          pIVar2->SettingsOffset = iVar6;
        }
        if (pIVar10->ID != pIVar2->ID) {
          __assert_fail("settings->ID == window->ID",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                        ,0x2a0c,
                        "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
        pIVar10->Pos = (ImVec2ih)
                       ((int)((pIVar2->Pos).x - (pIVar2->ViewportPos).x) & 0xffffU |
                       (int)((pIVar2->Pos).y - (pIVar2->ViewportPos).y) << 0x10);
        pIVar10->Size =
             (ImVec2ih)((int)(pIVar2->SizeFull).x & 0xffffU | (int)(pIVar2->SizeFull).y << 0x10);
        pIVar10->ViewportId = pIVar2->ViewportId;
        pIVar10->ViewportPos =
             (ImVec2ih)
             ((int)(pIVar2->ViewportPos).x & 0xffffU | (int)(pIVar2->ViewportPos).y << 0x10);
        if (pIVar2->DockNode == (ImGuiDockNode *)0x0) {
          IVar7 = pIVar2->DockId;
        }
        else {
          IVar7 = pIVar2->DockNode->ID;
          if (IVar7 != pIVar2->DockId) {
            __assert_fail("window->DockNode == __null || window->DockNode->ID == window->DockId",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                          ,0x2a11,
                          "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                         );
          }
        }
        pIVar10->DockId = IVar7;
        pIVar10->ClassId = (pIVar2->WindowClass).ClassId;
        pIVar10->DockOrder = pIVar2->DockOrder;
        pIVar10->Collapsed = pIVar2->Collapsed;
        uVar5 = (ctx->Windows).Size;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar5);
  }
  iVar6 = (buf->Buf).Size;
  iVar8 = iVar6 + -1;
  if (iVar6 == 0) {
    iVar8 = 0;
  }
  ImGuiTextBuffer::reserve(buf,iVar8 + (ctx->SettingsWindows).Buf.Size * 6);
  pcVar3 = (ctx->SettingsWindows).Buf.Data;
  if (pcVar3 != (char *)0x0) {
    pIVar10 = (ImGuiWindowSettings *)(pcVar3 + 4);
    do {
      ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pIVar10 + 1);
      if ((pIVar10->ViewportId != 0) && (pIVar10->ViewportId != 0x11111111)) {
        ImGuiTextBuffer::appendf
                  (buf,"ViewportPos=%d,%d\n",(ulong)(uint)(int)(pIVar10->ViewportPos).x,
                   (ulong)(uint)(int)(pIVar10->ViewportPos).y);
        ImGuiTextBuffer::appendf(buf,"ViewportId=0x%08X\n",(ulong)pIVar10->ViewportId);
      }
      sVar1 = (pIVar10->Pos).x;
      sVar4 = (pIVar10->Pos).y;
      if (sVar4 == 0 && sVar1 == 0) {
        if (pIVar10->ViewportId == 0x11111111) {
          sVar4 = 0;
          goto LAB_001d93a9;
        }
      }
      else {
LAB_001d93a9:
        ImGuiTextBuffer::appendf(buf,"Pos=%d,%d\n",(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar4);
      }
      sVar1 = (pIVar10->Size).x;
      sVar4 = (pIVar10->Size).y;
      if (sVar1 != 0 || sVar4 != 0) {
        ImGuiTextBuffer::appendf(buf,"Size=%d,%d\n",(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar4)
        ;
      }
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pIVar10->Collapsed);
      if (pIVar10->DockId != 0) {
        if (pIVar10->DockOrder == -1) {
          ImGuiTextBuffer::appendf(buf,"DockId=0x%08X\n");
        }
        else {
          ImGuiTextBuffer::appendf(buf,"DockId=0x%08X,%d\n");
        }
        if (pIVar10->ClassId != 0) {
          ImGuiTextBuffer::appendf(buf,"ClassId=0x%08X\n");
        }
      }
      ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      pIVar10 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar10);
    } while (pIVar10 != (ImGuiWindowSettings *)0x0);
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih(window->Pos - window->ViewportPos);
        settings->Size = ImVec2ih(window->SizeFull);
        settings->ViewportId = window->ViewportId;
        settings->ViewportPos = ImVec2ih(window->ViewportPos);
        IM_ASSERT(window->DockNode == NULL || window->DockNode->ID == window->DockId);
        settings->DockId = window->DockId;
        settings->ClassId = window->WindowClass.ClassId;
        settings->DockOrder = window->DockOrder;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        if (settings->ViewportId != 0 && settings->ViewportId != ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
        {
            buf->appendf("ViewportPos=%d,%d\n", settings->ViewportPos.x, settings->ViewportPos.y);
            buf->appendf("ViewportId=0x%08X\n", settings->ViewportId);
        }
        if (settings->Pos.x != 0 || settings->Pos.y != 0 || settings->ViewportId == ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
            buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        if (settings->Size.x != 0 || settings->Size.y != 0)
            buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        if (settings->DockId != 0)
        {
            // Write DockId as 4 digits if possible. Automatic DockId are small numbers, but full explicit DockSpace() are full ImGuiID range.
            if (settings->DockOrder == -1)
                buf->appendf("DockId=0x%08X\n", settings->DockId);
            else
                buf->appendf("DockId=0x%08X,%d\n", settings->DockId, settings->DockOrder);
            if (settings->ClassId != 0)
                buf->appendf("ClassId=0x%08X\n", settings->ClassId);
        }
        buf->append("\n");
    }
}